

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadEqn.c
# Opt level: O2

Abc_Ntk_t * Io_ReadEqn(char *pFileName,int fCheck)

{
  undefined8 *puVar1;
  byte *pStr;
  FILE *pFile;
  int iVar2;
  Extra_FileReader_t *p;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  Vec_Ptr_t *vTokens;
  void **ppvVar4;
  ProgressBar *p_00;
  void *pvVar5;
  char *pStr_00;
  Abc_Obj_t *pAVar6;
  Hop_Obj_t *pHVar7;
  
  p = Extra_FileReaderAlloc(pFileName,"#",";","=");
  if (p != (Extra_FileReader_t *)0x0) {
    pNtk = Abc_NtkAlloc(ABC_NTK_NETLIST,ABC_FUNC_AIG,1);
    pcVar3 = Extra_FileReaderGetFileName(p);
    pcVar3 = Extra_FileNameGeneric(pcVar3);
    pNtk->pName = pcVar3;
    pcVar3 = Extra_FileReaderGetFileName(p);
    pcVar3 = Extra_UtilStrsav(pcVar3);
    pNtk->pSpec = pcVar3;
    vTokens = (Vec_Ptr_t *)malloc(0x10);
    vTokens->nCap = 100;
    vTokens->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    vTokens->pArray = ppvVar4;
    pFile = _stdout;
    iVar2 = Extra_FileReaderGetFileSize(p);
    p_00 = Extra_ProgressBarStart(pFile,iVar2);
    while (pvVar5 = Extra_FileReaderGetTokens(p), pvVar5 != (void *)0x0) {
      iVar2 = Extra_FileReaderGetCurPosition(p);
      if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= iVar2)) {
        Extra_ProgressBarUpdate_int(p_00,iVar2,(char *)0x0);
      }
      Io_ReadEqnStrCompact((char *)**(undefined8 **)((long)pvVar5 + 8));
      puVar1 = *(undefined8 **)((long)pvVar5 + 8);
      pcVar3 = (char *)*puVar1;
      if (*pcVar3 == '\0') break;
      if (*(int *)((long)pvVar5 + 4) != 2) {
        pcVar3 = Extra_FileReaderGetFileName(p);
        printf("%s: Wrong input file format.\n",pcVar3);
        Abc_NtkDelete(pNtk);
        pNtk = (Abc_Ntk_t *)0x0;
        goto LAB_006d3197;
      }
      iVar2 = strncmp(pcVar3,"INORDER",7);
      if (iVar2 == 0) {
        Io_ReadEqnStrCutAt((char *)puVar1[1]," \n\r\t",0,vTokens);
        for (iVar2 = 0; iVar2 < vTokens->nSize; iVar2 = iVar2 + 1) {
          pcVar3 = (char *)Vec_PtrEntry(vTokens,iVar2);
          Io_ReadCreatePi(pNtk,pcVar3);
        }
      }
      else {
        iVar2 = strncmp(pcVar3,"OUTORDER",8);
        pStr = (byte *)puVar1[1];
        if (iVar2 == 0) {
          Io_ReadEqnStrCutAt((char *)pStr," \n\r\t",0,vTokens);
          for (iVar2 = 0; iVar2 < vTokens->nSize; iVar2 = iVar2 + 1) {
            pcVar3 = (char *)Vec_PtrEntry(vTokens,iVar2);
            Io_ReadCreatePo(pNtk,pcVar3);
          }
        }
        else {
          Io_ReadEqnStrCompact((char *)pStr);
          if ((pStr[1] == 0) && ((*pStr & 0xfe) == 0x30)) {
            vTokens->nSize = 0;
            iVar2 = 0;
            pStr_00 = (char *)0x0;
          }
          else {
            pStr_00 = Extra_UtilStrsav((char *)pStr);
            Io_ReadEqnStrCutAt(pStr_00,"!*+()",1,vTokens);
            iVar2 = vTokens->nSize;
          }
          pAVar6 = Io_ReadCreateNode(pNtk,pcVar3,(char **)vTokens->pArray,iVar2);
          pHVar7 = Parse_FormulaParserEqn(_stdout,(char *)pStr,vTokens,(Hop_Man_t *)pNtk->pManFunc);
          (pAVar6->field_5).pData = pHVar7;
          free(pStr_00);
        }
      }
    }
    Extra_ProgressBarStop(p_00);
    free(vTokens->pArray);
    free(vTokens);
    Abc_NtkFinalizeRead(pNtk);
LAB_006d3197:
    Extra_FileReaderFree(p);
    if (pNtk != (Abc_Ntk_t *)0x0) {
      if (fCheck == 0) {
        return pNtk;
      }
      iVar2 = Abc_NtkCheckRead(pNtk);
      if (iVar2 != 0) {
        return pNtk;
      }
      puts("Io_ReadEqn: The network check has failed.");
      Abc_NtkDelete(pNtk);
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadEqn( char * pFileName, int fCheck )
{
    Extra_FileReader_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Extra_FileReaderAlloc( pFileName, "#", ";", "=" );
    if ( p == NULL )
        return NULL;

    // read the network
    pNtk = Io_ReadEqnNetwork( p );
    Extra_FileReaderFree( p );
    if ( pNtk == NULL )
        return NULL;

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadEqn: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}